

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestCoverageHandler.cxx
# Opt level: O2

bool __thiscall
cmCTestCoverageHandler::ShouldIDoCoverage
          (cmCTestCoverageHandler *this,string *file,string *srcDir,string *binDir)

{
  pointer pRVar1;
  cmCTest *pcVar2;
  bool bVar3;
  bool bVar4;
  __type _Var5;
  ostream *poVar6;
  pointer this_00;
  allocator<char> local_2a9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2a8;
  string fFile;
  string relPath;
  string checkDir;
  string fSrcDir;
  string ndc;
  string fBinDir;
  string fileDir;
  ostringstream cmCTestLog_msg;
  
  bVar3 = IsFilteredOut(this,file);
  if (!bVar3) {
    this_00 = (this->CustomCoverageExcludeRegex).
              super__Vector_base<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pRVar1 = (this->CustomCoverageExcludeRegex).
             super__Vector_base<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    do {
      if (this_00 == pRVar1) {
        cmsys::SystemTools::CollapseFullPath(&fSrcDir,srcDir);
        cmsys::SystemTools::CollapseFullPath(&fBinDir,binDir);
        cmsys::SystemTools::CollapseFullPath(&fFile,file);
        bVar3 = cmsys::SystemTools::IsSubDirectory(&fFile,&fSrcDir);
        bVar4 = cmsys::SystemTools::IsSubDirectory(&fFile,&fBinDir);
        cmsys::SystemTools::GetFilenamePath(&fileDir,&fFile);
        checkDir._M_dataplus._M_p = (pointer)&checkDir.field_2;
        checkDir._M_string_length = 0;
        checkDir.field_2._M_local_buf[0] = '\0';
        if ((bVar3 && bVar4) || (bVar4 || bVar3)) {
          std::__cxx11::string::_M_assign((string *)&checkDir);
        }
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&cmCTestLog_msg,".NoDartCoverage",(allocator<char> *)&relPath);
        cmSystemTools::FileExistsInParentDirectories
                  (&ndc,(string *)&cmCTestLog_msg,&fFile,&checkDir);
        std::__cxx11::string::~string((string *)&cmCTestLog_msg);
        if (ndc._M_string_length == 0) {
          relPath._M_dataplus._M_p = (pointer)&relPath.field_2;
          relPath._M_string_length = 0;
          relPath.field_2._M_local_buf[0] = '\0';
          if (checkDir._M_string_length == 0) {
            std::__cxx11::string::_M_assign((string *)&relPath);
          }
          else {
            cmSystemTools::RelativePath((string *)&cmCTestLog_msg,&checkDir,&fFile);
            std::__cxx11::string::operator=((string *)&relPath,(string *)&cmCTestLog_msg);
            std::__cxx11::string::~string((string *)&cmCTestLog_msg);
          }
          std::operator==(&checkDir,&fSrcDir);
          std::__cxx11::string::_M_assign((string *)&checkDir);
          std::operator+(&local_2a8,&checkDir,"/");
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &cmCTestLog_msg,&local_2a8,&relPath);
          std::__cxx11::string::operator=((string *)&fFile,(string *)&cmCTestLog_msg);
          std::__cxx11::string::~string((string *)&cmCTestLog_msg);
          std::__cxx11::string::~string((string *)&local_2a8);
          cmsys::SystemTools::GetFilenamePath((string *)&cmCTestLog_msg,&fFile);
          std::__cxx11::string::operator=((string *)&fFile,(string *)&cmCTestLog_msg);
          std::__cxx11::string::~string((string *)&cmCTestLog_msg);
          _Var5 = std::operator==(&fileDir,&fFile);
          bVar3 = true;
          if (!_Var5) {
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_2a8,".NoDartCoverage",&local_2a9);
            cmSystemTools::FileExistsInParentDirectories
                      ((string *)&cmCTestLog_msg,&local_2a8,&fFile,&checkDir);
            std::__cxx11::string::operator=((string *)&ndc,(string *)&cmCTestLog_msg);
            std::__cxx11::string::~string((string *)&cmCTestLog_msg);
            std::__cxx11::string::~string((string *)&local_2a8);
            if (ndc._M_string_length != 0) {
              std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
              poVar6 = std::operator<<((ostream *)&cmCTestLog_msg,"Found: ");
              poVar6 = std::operator<<(poVar6,(string *)&ndc);
              poVar6 = std::operator<<(poVar6," so skip coverage of: ");
              poVar6 = std::operator<<(poVar6,(string *)file);
              std::endl<char,std::char_traits<char>>(poVar6);
              pcVar2 = (this->super_cmCTestGenericHandler).CTest;
              std::__cxx11::stringbuf::str();
              cmCTest::Log(pcVar2,5,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestCoverageHandler.cxx"
                           ,0x10d,local_2a8._M_dataplus._M_p,
                           (this->super_cmCTestGenericHandler).Quiet);
              std::__cxx11::string::~string((string *)&local_2a8);
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
              bVar3 = false;
            }
          }
          std::__cxx11::string::~string((string *)&relPath);
        }
        else {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
          poVar6 = std::operator<<((ostream *)&cmCTestLog_msg,"Found: ");
          poVar6 = std::operator<<(poVar6,(string *)&ndc);
          poVar6 = std::operator<<(poVar6," so skip coverage of ");
          poVar6 = std::operator<<(poVar6,(string *)file);
          std::endl<char,std::char_traits<char>>(poVar6);
          pcVar2 = (this->super_cmCTestGenericHandler).CTest;
          std::__cxx11::stringbuf::str();
          cmCTest::Log(pcVar2,5,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestCoverageHandler.cxx"
                       ,0xed,relPath._M_dataplus._M_p,(this->super_cmCTestGenericHandler).Quiet);
          std::__cxx11::string::~string((string *)&relPath);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
          bVar3 = false;
        }
        std::__cxx11::string::~string((string *)&ndc);
        std::__cxx11::string::~string((string *)&checkDir);
        std::__cxx11::string::~string((string *)&fileDir);
        std::__cxx11::string::~string((string *)&fFile);
        std::__cxx11::string::~string((string *)&fBinDir);
        std::__cxx11::string::~string((string *)&fSrcDir);
        return bVar3;
      }
      bVar3 = cmsys::RegularExpression::find(this_00,file);
      this_00 = this_00 + 1;
    } while (!bVar3);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
    poVar6 = std::operator<<((ostream *)&cmCTestLog_msg,"  File ");
    poVar6 = std::operator<<(poVar6,(string *)file);
    poVar6 = std::operator<<(poVar6," is excluded in CTestCustom.ctest");
    std::endl<char,std::char_traits<char>>(poVar6);
    pcVar2 = (this->super_cmCTestGenericHandler).CTest;
    std::__cxx11::stringbuf::str();
    cmCTest::Log(pcVar2,5,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestCoverageHandler.cxx"
                 ,0xcd,fSrcDir._M_dataplus._M_p,(this->super_cmCTestGenericHandler).Quiet);
    std::__cxx11::string::~string((string *)&fSrcDir);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
  }
  return false;
}

Assistant:

bool cmCTestCoverageHandler::ShouldIDoCoverage(std::string const& file,
                                               std::string const& srcDir,
                                               std::string const& binDir)
{
  if (this->IsFilteredOut(file)) {
    return false;
  }

  for (cmsys::RegularExpression& rx : this->CustomCoverageExcludeRegex) {
    if (rx.find(file)) {
      cmCTestOptionalLog(
        this->CTest, HANDLER_VERBOSE_OUTPUT,
        "  File " << file << " is excluded in CTestCustom.ctest" << std::endl;
        , this->Quiet);
      return false;
    }
  }

  std::string fSrcDir = cmSystemTools::CollapseFullPath(srcDir);
  std::string fBinDir = cmSystemTools::CollapseFullPath(binDir);
  std::string fFile = cmSystemTools::CollapseFullPath(file);
  bool sourceSubDir = cmSystemTools::IsSubDirectory(fFile, fSrcDir);
  bool buildSubDir = cmSystemTools::IsSubDirectory(fFile, fBinDir);
  // Always check parent directory of the file.
  std::string fileDir = cmSystemTools::GetFilenamePath(fFile);
  std::string checkDir;

  // We also need to check the binary/source directory pair.
  if (sourceSubDir && buildSubDir) {
    if (fSrcDir.size() > fBinDir.size()) {
      checkDir = fSrcDir;
    } else {
      checkDir = fBinDir;
    }
  } else if (sourceSubDir) {
    checkDir = fSrcDir;
  } else if (buildSubDir) {
    checkDir = fBinDir;
  }
  std::string ndc = cmSystemTools::FileExistsInParentDirectories(
    ".NoDartCoverage", fFile, checkDir);
  if (!ndc.empty()) {
    cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                       "Found: " << ndc << " so skip coverage of " << file
                                 << std::endl,
                       this->Quiet);
    return false;
  }

  // By now checkDir should be set to parent directory of the file.
  // Get the relative path to the file an apply it to the opposite directory.
  // If it is the same as fileDir, then ignore, otherwise check.
  std::string relPath;
  if (!checkDir.empty()) {
    relPath = cmSystemTools::RelativePath(checkDir, fFile);
  } else {
    relPath = fFile;
  }
  if (checkDir == fSrcDir) {
    checkDir = fBinDir;
  } else {
    checkDir = fSrcDir;
  }
  fFile = checkDir + "/" + relPath;
  fFile = cmSystemTools::GetFilenamePath(fFile);

  if (fileDir == fFile) {
    // This is in-source build, so we trust the previous check.
    return true;
  }

  ndc = cmSystemTools::FileExistsInParentDirectories(".NoDartCoverage", fFile,
                                                     checkDir);
  if (!ndc.empty()) {
    cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                       "Found: " << ndc << " so skip coverage of: " << file
                                 << std::endl,
                       this->Quiet);
    return false;
  }
  // Ok, nothing in source tree, nothing in binary tree
  return true;
}